

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O0

void __thiscall
EmmyDebuggerManager::SetHitDebugger(EmmyDebuggerManager *this,shared_ptr<Debugger> *debugger)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  shared_ptr<Debugger> *debugger_local;
  EmmyDebuggerManager *this_local;
  
  lock._M_device = (mutex_type *)debugger;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->breakDebuggerMtx);
  std::shared_ptr<Debugger>::operator=(&this->hitDebugger,debugger);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void EmmyDebuggerManager::SetHitDebugger(std::shared_ptr<Debugger> debugger)
{
	std::lock_guard<std::mutex> lock(breakDebuggerMtx);
	hitDebugger = debugger;
}